

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.hpp
# Opt level: O0

void __thiscall
Storage::Disk::PCMSegment::PCMSegment(PCMSegment *this,size_t number_of_bits,uint8_t *source)

{
  uint8_t *__n;
  reference rVar1;
  reference local_50;
  uint8_t *local_40;
  size_t c;
  allocator<bool> local_22;
  bool local_21;
  uint8_t *local_20;
  uint8_t *source_local;
  size_t number_of_bits_local;
  PCMSegment *this_local;
  
  local_20 = source;
  source_local = (uint8_t *)number_of_bits;
  number_of_bits_local = (size_t)this;
  Time::Time(&this->length_of_a_bit,1);
  __n = source_local;
  local_21 = false;
  std::allocator<bool>::allocator(&local_22);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->data,(size_type)__n,&local_21,&local_22);
  std::allocator<bool>::~allocator(&local_22);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->fuzzy_mask);
  for (local_40 = (uint8_t *)0x0; local_40 < source_local; local_40 = local_40 + 1) {
    if (((int)(uint)local_20[(ulong)local_40 >> 3] >> ((byte)local_40 & 7 ^ 7) & 1U) != 0) {
      rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->data,(size_type)local_40);
      local_50 = rVar1;
      std::_Bit_reference::operator=(&local_50,true);
    }
  }
  return;
}

Assistant:

PCMSegment(size_t number_of_bits, const uint8_t *source)
		: data(number_of_bits, false) {
		for(size_t c = 0; c < number_of_bits; ++c) {
			if((source[c >> 3] >> (7 ^ (c & 7)))&1) {
				data[c] = true;
			}
		}
	}